

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l5_full.c
# Opt level: O0

int picnic_l5_full_read_public_key(picnic_l5_full_publickey_t *key,uint8_t *buf,size_t buflen)

{
  int iVar1;
  picnic_instance_t *ppVar2;
  ulong in_RDX;
  char *in_RSI;
  void *in_RDI;
  picnic_instance_t *instance;
  picnic_params_t param;
  
  if (((((in_RDI != (void *)0x0) && (in_RSI != (char *)0x0)) && (in_RDX != 0)) &&
      ((*in_RSI == '\f' &&
       (ppVar2 = picnic_instance_get(Picnic_L5_full), ppVar2 != (picnic_instance_t *)0x0)))) &&
     ((0x40 < in_RDX &&
      ((iVar1 = check_padding_bits(in_RSI[0x20],1), iVar1 == 0 &&
       (iVar1 = check_padding_bits(in_RSI[0x40],1), iVar1 == 0)))))) {
    memcpy(in_RDI,in_RSI + 1,0x40);
    return 0;
  }
  return -1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l5_full_read_public_key(picnic_l5_full_publickey_t* key,
                                                           const uint8_t* buf, size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param = buf[0];
  if (param != PARAM) {
    return -1;
  }
  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  if (buflen < PUBLIC_KEY_SIZE) {
    return -1;
  }

#if (LOWMC_BLOCK_BITS & 0x7) != 0
  static const unsigned int diff = LOWMC_BLOCK_SZ * 8 - LOWMC_BLOCK_BITS;
  if (check_padding_bits(buf[1 + LOWMC_BLOCK_SZ - 1], diff) ||
      check_padding_bits(buf[1 + 2 * LOWMC_BLOCK_SZ - 1], diff)) {
    return -1;
  }
#endif

  memcpy(key->data, buf + 1, PUBLIC_KEY_SIZE - 1);
  return 0;
}